

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorProto::unsafe_arena_set_allocated_source_code_info
          (FileDescriptorProto *this,SourceCodeInfo *source_code_info)

{
  void *pvVar1;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x18);
  }
  if ((pvVar1 == (void *)0x0) && (this->source_code_info_ != (SourceCodeInfo *)0x0)) {
    (*(this->source_code_info_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  this->source_code_info_ = source_code_info;
  (this->_has_bits_).has_bits_[0] =
       (uint)(source_code_info != (SourceCodeInfo *)0x0) << 4 |
       (this->_has_bits_).has_bits_[0] & 0xffffffef;
  return;
}

Assistant:

void FileDescriptorProto::unsafe_arena_set_allocated_source_code_info(
    PROTOBUF_NAMESPACE_ID::SourceCodeInfo* source_code_info) {
  if (GetArenaNoVirtual() == nullptr) {
    delete source_code_info_;
  }
  source_code_info_ = source_code_info;
  if (source_code_info) {
    _has_bits_[0] |= 0x00000010u;
  } else {
    _has_bits_[0] &= ~0x00000010u;
  }
  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:google.protobuf.FileDescriptorProto.source_code_info)
}